

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O3

void readRgba1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  Rgba *pRVar6;
  int iVar7;
  long lVar8;
  RgbaInputFile file;
  Rgba local_70 [8];
  
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_70,fileName,iVar2);
  piVar4 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar2 = *piVar4;
  iVar1 = piVar4[1];
  iVar7 = piVar4[3];
  *width = (piVar4[2] - iVar2) + 1;
  iVar3 = (iVar7 - iVar1) + 1;
  *height = iVar3;
  iVar7 = *width;
  lVar8 = (long)iVar7;
  uVar5 = lVar8 * iVar3;
  pRVar6 = (Rgba *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  if (pixels->_data != (Rgba *)0x0) {
    operator_delete__(pixels->_data);
    iVar7 = *width;
  }
  pixels->_sizeX = (long)iVar3;
  pixels->_sizeY = lVar8;
  pixels->_data = pRVar6;
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_70,(ulong)(pRVar6 + (-(long)iVar2 - (long)(iVar7 * iVar1))),1);
  Imf_3_2::RgbaInputFile::readPixels((int)local_70,iVar1);
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_70);
  return;
}

Assistant:

void
readRgba1 (
    const char fileName[], Array2D<Rgba>& pixels, int& width, int& height)
{
    //
    // Read an RGBA image using class RgbaInputFile:
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the memory layout of the pixels
    //	- read the pixels from the file
    //

    RgbaInputFile file (fileName);
    Box2i         dw = file.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);
    file.readPixels (dw.min.y, dw.max.y);
}